

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaAllocator_T::GetAllocationInfo
          (VmaAllocator_T *this,VmaAllocation hAllocation,VmaAllocationInfo *pAllocationInfo)

{
  uint32_t uVar1;
  VkDeviceMemory pVVar2;
  VkDeviceSize VVar3;
  void *pvVar4;
  char *pcVar5;
  uint32_t *in_RDX;
  VmaAllocation_T *in_RSI;
  VmaAllocation_T *in_RDI;
  
  uVar1 = VmaAllocation_T::GetMemoryTypeIndex(in_RSI);
  *in_RDX = uVar1;
  pVVar2 = VmaAllocation_T::GetMemory(in_RDI);
  *(VkDeviceMemory *)(in_RDX + 2) = pVVar2;
  VVar3 = VmaAllocation_T::GetOffset(in_RDI);
  *(VkDeviceSize *)(in_RDX + 4) = VVar3;
  VVar3 = VmaAllocation_T::GetSize(in_RSI);
  *(VkDeviceSize *)(in_RDX + 6) = VVar3;
  pvVar4 = VmaAllocation_T::GetMappedData(hAllocation);
  *(void **)(in_RDX + 8) = pvVar4;
  pvVar4 = VmaAllocation_T::GetUserData(in_RSI);
  *(void **)(in_RDX + 10) = pvVar4;
  pcVar5 = VmaAllocation_T::GetName(in_RSI);
  *(char **)(in_RDX + 0xc) = pcVar5;
  return;
}

Assistant:

void VmaAllocator_T::GetAllocationInfo(VmaAllocation hAllocation, VmaAllocationInfo* pAllocationInfo)
{
    pAllocationInfo->memoryType = hAllocation->GetMemoryTypeIndex();
    pAllocationInfo->deviceMemory = hAllocation->GetMemory();
    pAllocationInfo->offset = hAllocation->GetOffset();
    pAllocationInfo->size = hAllocation->GetSize();
    pAllocationInfo->pMappedData = hAllocation->GetMappedData();
    pAllocationInfo->pUserData = hAllocation->GetUserData();
    pAllocationInfo->pName = hAllocation->GetName();
}